

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandMatch(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  uint nDist;
  int iVar3;
  Abc_Ntk_t *pNtk;
  char *pcVar4;
  uint fVerbose;
  int fDelete2;
  int fDelete1;
  Abc_Ntk_t *pNtk2;
  uint local_44;
  Abc_Ntk_t *local_40;
  Abc_Ntk_t *pNtk1;
  
  local_40 = Abc_FrameReadNtk(pAbc);
  bVar1 = false;
  Extra_UtilGetoptReset();
  fVerbose = 1;
  nDist = 0;
LAB_0026d214:
  do {
    while (iVar2 = Extra_UtilGetopt(argc,argv,"Dmvh"), iVar3 = globalUtilOptind, iVar2 == 0x76) {
      fVerbose = fVerbose ^ 1;
    }
    if (iVar2 == -1) {
      if (bVar1) {
        if (local_40->ntkType != ABC_NTK_STRASH) {
          pcVar4 = "This command works only for structrally hashed networks. Run \"st\".\n";
LAB_0026d3af:
          Abc_Print(-1,pcVar4);
          return 0;
        }
        pNtk = Abc_NtkDarMatch(local_40,(Abc_Ntk_t *)0x0,nDist,fVerbose);
      }
      else {
        iVar3 = Abc_NtkPrepareTwoNtks
                          (_stdout,local_40,argv + globalUtilOptind,argc - globalUtilOptind,&pNtk1,
                           &pNtk2,&fDelete1,&fDelete2,1);
        if (iVar3 == 0) {
          return 1;
        }
        if ((pNtk1->nObjCounts[8] == 0) || (pNtk2->nObjCounts[8] == 0)) {
          if (fDelete1 != 0) {
            Abc_NtkDelete(pNtk1);
          }
          if (fDelete2 != 0) {
            Abc_NtkDelete(pNtk2);
          }
          pcVar4 = "The network has no latches. Used combinational command \"cec\".\n";
          goto LAB_0026d3af;
        }
        pNtk = Abc_NtkDarMatch(pNtk1,pNtk2,nDist,fVerbose);
        if (fDelete1 != 0) {
          Abc_NtkDelete(pNtk1);
        }
        if (fDelete2 != 0) {
          Abc_NtkDelete(pNtk2);
        }
      }
      if (pNtk != (Abc_Ntk_t *)0x0) {
        Abc_FrameReplaceCurrentNetwork(pAbc,pNtk);
        return 0;
      }
      pcVar4 = "Matching has failed.\n";
      iVar3 = -1;
      goto LAB_0026d4bf;
    }
    if (iVar2 == 0x6d) {
      bVar1 = (bool)(bVar1 ^ 1);
      goto LAB_0026d214;
    }
    if (iVar2 != 0x44) goto LAB_0026d3da;
    local_44 = nDist;
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-D\" should be followed by an integer.\n");
      nDist = local_44;
      goto LAB_0026d3da;
    }
    nDist = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar3 + 1;
    if ((int)nDist < 0) {
LAB_0026d3da:
      Abc_Print(-2,"usage: match [-D num] [-mv] <file1> <file2>\n");
      Abc_Print(-2,"\t         detects structural similarity using simulation\n");
      Abc_Print(-2,"\t         replaces the current network by the miter of differences\n");
      Abc_Print(-2,"\t-D num : the distance for extending differences [default = %d]\n",(ulong)nDist
               );
      pcVar4 = "miter";
      if (!bVar1) {
        pcVar4 = "two networks";
      }
      Abc_Print(-2,"\t-m     : toggles miter vs. two networks [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (fVerbose == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-v     : toggles verbose output [default = %s]\n",pcVar4);
      Abc_Print(-2,"\tfile1  : (optional) the file with the first network\n");
      Abc_Print(-2,"\tfile2  : (optional) the file with the second network\n");
      Abc_Print(-2,"\t         if no files are given, uses the current network and its spec\n");
      pcVar4 = "\t         if one file is given, uses the current network and the file\n";
      iVar3 = -2;
LAB_0026d4bf:
      Abc_Print(iVar3,pcVar4);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandMatch( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtk1, * pNtk2, * pNtkRes;
    int fDelete1, fDelete2;
    char ** pArgvNew;
    int nArgcNew, c;
    int fMiter;
    int nDist;
    int fVerbose;

    extern Abc_Ntk_t * Abc_NtkDarMatch( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int nDist, int fVerbose );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    fMiter = 0;
    nDist = 0;
    fVerbose = 1;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Dmvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by an integer.\n" );
                goto usage;
            }
            nDist = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nDist < 0 )
                goto usage;
            break;
        case 'm':
            fMiter ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        default:
            goto usage;
        }
    }

    if ( fMiter )
    {
//        Abc_Ntk_t * pNtkA, * pNtkB;
        if ( !Abc_NtkIsStrash(pNtk) )
        {
            Abc_Print( -1, "This command works only for structrally hashed networks. Run \"st\".\n" );
            return 0;
        }
        pNtkRes = Abc_NtkDarMatch( pNtk, NULL, nDist, fVerbose );
/*
        pNtkA = Abc_NtkDup( pNtk );
        pNtkB = Abc_NtkDup( pNtk );
        Abc_NtkDarSimSec( pNtkA, pNtkB, pPars );
        Abc_NtkDelete( pNtkA );
        Abc_NtkDelete( pNtkB );
*/
    }
    else
    {
        pArgvNew = argv + globalUtilOptind;
        nArgcNew = argc - globalUtilOptind;
        if ( !Abc_NtkPrepareTwoNtks( stdout, pNtk, pArgvNew, nArgcNew, &pNtk1, &pNtk2, &fDelete1, &fDelete2, 1 ) )
            return 1;
        if ( Abc_NtkLatchNum(pNtk1) == 0 || Abc_NtkLatchNum(pNtk2) == 0 )
        {
            if ( fDelete1 ) Abc_NtkDelete( pNtk1 );
            if ( fDelete2 ) Abc_NtkDelete( pNtk2 );
            Abc_Print( -1, "The network has no latches. Used combinational command \"cec\".\n" );
            return 0;
        }
        // perform verification
        pNtkRes = Abc_NtkDarMatch( pNtk1, pNtk2, nDist, fVerbose );
        if ( fDelete1 ) Abc_NtkDelete( pNtk1 );
        if ( fDelete2 ) Abc_NtkDelete( pNtk2 );
    }
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Matching has failed.\n" );
        return 1;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: match [-D num] [-mv] <file1> <file2>\n" );
    Abc_Print( -2, "\t         detects structural similarity using simulation\n" );
    Abc_Print( -2, "\t         replaces the current network by the miter of differences\n" );
    Abc_Print( -2, "\t-D num : the distance for extending differences [default = %d]\n", nDist );
    Abc_Print( -2, "\t-m     : toggles miter vs. two networks [default = %s]\n", fMiter? "miter": "two networks" );
    Abc_Print( -2, "\t-v     : toggles verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\tfile1  : (optional) the file with the first network\n");
    Abc_Print( -2, "\tfile2  : (optional) the file with the second network\n");
    Abc_Print( -2, "\t         if no files are given, uses the current network and its spec\n");
    Abc_Print( -2, "\t         if one file is given, uses the current network and the file\n");
    return 1;
}